

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O1

EVP_PKEY * EVP_PKEY_new_raw_private_key(int type,ENGINE *unused,uint8_t *in,size_t len)

{
  _func_void_EVP_PKEY_ptr *p_Var1;
  int iVar2;
  EVP_PKEY *pEVar3;
  EVP_PKEY *pEVar4;
  EVP_PKEY_ASN1_METHOD *pEVar5;
  EVP_PKEY *pkey;
  
  if (type == 0x3b4) {
    pEVar5 = &x25519_asn1_meth;
  }
  else {
    if (type != 0x3b5) {
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                    ,0xf7);
      return (EVP_PKEY *)0x0;
    }
    pEVar5 = &ed25519_asn1_meth;
  }
  pEVar3 = (EVP_PKEY *)OPENSSL_zalloc(0x18);
  if (pEVar3 == (EVP_PKEY *)0x0) {
    pEVar3 = (EVP_PKEY *)0x0;
  }
  else {
    pEVar3->type = 1;
    pEVar3->save_type = 0;
  }
  if (pEVar3 == (EVP_PKEY *)0x0) {
    pEVar4 = (EVP_PKEY *)0x0;
    pkey = pEVar3;
  }
  else {
    if (((EVP_PKEY_ASN1_METHOD *)pEVar3->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
       (p_Var1 = ((EVP_PKEY_ASN1_METHOD *)pEVar3->ameth)->pkey_free,
       p_Var1 != (_func_void_EVP_PKEY_ptr *)0x0)) {
      (*p_Var1)((EVP_PKEY *)pEVar3);
      *(void **)&pEVar3->references = (void *)0x0;
      pEVar3->save_type = 0;
    }
    pEVar3->ameth = (EVP_PKEY_ASN1_METHOD *)pEVar5;
    pEVar3->save_type = pEVar5->pkey_id;
    iVar2 = (*pEVar5->set_priv_raw)((EVP_PKEY *)pEVar3,in,len);
    pEVar4 = pEVar3;
    pkey = (EVP_PKEY *)0x0;
    if (iVar2 == 0) {
      pEVar4 = (EVP_PKEY *)0x0;
      pkey = pEVar3;
    }
  }
  if (pkey != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(pkey);
  }
  return (EVP_PKEY *)pEVar4;
}

Assistant:

EVP_PKEY *EVP_PKEY_new_raw_private_key(int type, ENGINE *unused,
                                       const uint8_t *in, size_t len) {
  // To avoid pulling in all key types, look for specifically the key types that
  // support |set_priv_raw|.
  const EVP_PKEY_ASN1_METHOD *method;
  switch (type) {
    case EVP_PKEY_X25519:
      method = &x25519_asn1_meth;
      break;
    case EVP_PKEY_ED25519:
      method = &ed25519_asn1_meth;
      break;
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
      return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  if (!ret->ameth->set_priv_raw(ret.get(), in, len)) {
    return nullptr;
  }

  return ret.release();
}